

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

void write1_cb(uv_write_t *req,int status)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined1 *puVar3;
  long *extraout_RDX;
  uv_write_t *unaff_RBX;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_100 [8];
  undefined8 uStack_f8;
  undefined8 uStack_e8;
  code *pcStack_e0;
  long lStack_d0;
  long lStack_c8;
  undefined1 auStack_c0 [16];
  long alStack_b0 [13];
  uv_write_t *puStack_48;
  undefined8 uStack_40;
  undefined1 *puStack_38;
  uv_write_t *puStack_30;
  undefined8 local_28;
  long local_20;
  undefined1 local_18 [16];
  
  puVar4 = &local_28;
  if (req == (uv_write_t *)0x0) {
    puStack_30 = (uv_write_t *)0x1cdf6a;
    write1_cb_cold_3();
  }
  else {
    unaff_RBX = req;
    if (status != 0) {
      if (shutdown_cb_called != 0) {
        return;
      }
      puStack_30 = (uv_write_t *)0x1cdef7;
      write1_cb_cold_1();
      unaff_RBX = req;
    }
    if (shutdown_requested != 0) {
      return;
    }
    puStack_30 = (uv_write_t *)0x1cdf14;
    local_18 = uv_buf_init("P",1);
    puStack_30 = (uv_write_t *)0x1cdf3f;
    iVar1 = uv_write(&write_req,unaff_RBX->handle,local_18,1,write1_cb);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 == 0) {
      write_cb_called = write_cb_called + 1;
      return;
    }
  }
  plVar5 = &local_20;
  puStack_30 = (uv_write_t *)read1_cb;
  write1_cb_cold_2();
  puStack_30 = unaff_RBX;
  if (plVar5 == (long *)0x0) {
LAB_001ce000:
    puStack_48 = (uv_write_t *)0x1ce005;
    read1_cb_cold_3();
  }
  else {
    if (-1 < (long)puVar4) {
      if (puVar4 != (undefined8 *)0x0) {
        puVar3 = (undefined1 *)0x0;
        do {
          puStack_38 = (undefined1 *)(long)(char)puVar3[*extraout_RDX];
          uStack_40 = 0x50;
          if (puStack_38 != (undefined1 *)0x50) {
            puStack_48 = (uv_write_t *)0x1ce000;
            read1_cb_cold_2();
            goto LAB_001ce000;
          }
          puVar3 = puVar3 + 1;
        } while (puVar4 != (undefined8 *)puVar3);
      }
      return;
    }
    uStack_40 = 0xfffffffffffff001;
    puStack_38 = (undefined1 *)puVar4;
    if (puVar4 == (undefined8 *)0xfffffffffffff001) {
      puStack_48 = (uv_write_t *)0x1cdfdf;
      puts("GOT EOF");
      uv_close(plVar5,close_cb);
      return;
    }
  }
  puStack_48 = (uv_write_t *)0x1ce012;
  read1_cb_cold_1();
  pcStack_e0 = (code *)0x1ce032;
  puStack_48 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_c0);
  alStack_b0[0] = (long)iVar1;
  lStack_d0 = 0;
  if (alStack_b0[0] == 0) {
    pcStack_e0 = (code *)0x1ce057;
    uVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ce066;
    iVar1 = uv_timer_init(uVar2,&timer_handle);
    alStack_b0[0] = (long)iVar1;
    lStack_d0 = 0;
    if (alStack_b0[0] != 0) goto LAB_001ce191;
    pcStack_e0 = (code *)0x1ce08b;
    uVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ce09a;
    iVar1 = uv_tcp_init(uVar2,&tcp_handle);
    alStack_b0[0] = (long)iVar1;
    lStack_d0 = 0;
    if (alStack_b0[0] != 0) goto LAB_001ce1a0;
    pcStack_e0 = (code *)0x1ce0d7;
    iVar1 = uv_tcp_connect(alStack_b0,&tcp_handle,auStack_c0,connect_cb);
    lStack_d0 = (long)iVar1;
    lStack_c8 = 0;
    if (lStack_d0 != 0) goto LAB_001ce1af;
    pcStack_e0 = (code *)0x1ce0fc;
    uVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ce106;
    iVar1 = uv_run(uVar2,0);
    lStack_d0 = (long)iVar1;
    lStack_c8 = 0;
    if (lStack_d0 != 0) goto LAB_001ce1be;
    pcStack_e0 = (code *)0x1ce12b;
    uVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ce13f;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_e0 = (code *)0x1ce149;
    uv_run(uVar2,0);
    lStack_d0 = 0;
    pcStack_e0 = (code *)0x1ce157;
    uVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ce15f;
    iVar1 = uv_loop_close(uVar2);
    lStack_c8 = (long)iVar1;
    if (lStack_d0 == lStack_c8) {
      pcStack_e0 = (code *)0x1ce177;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_e0 = (code *)0x1ce191;
    run_test_tcp_read_stop_cold_1();
LAB_001ce191:
    pcStack_e0 = (code *)0x1ce1a0;
    run_test_tcp_read_stop_cold_2();
LAB_001ce1a0:
    pcStack_e0 = (code *)0x1ce1af;
    run_test_tcp_read_stop_cold_3();
LAB_001ce1af:
    pcStack_e0 = (code *)0x1ce1be;
    run_test_tcp_read_stop_cold_4();
LAB_001ce1be:
    pcStack_e0 = (code *)0x1ce1cd;
    run_test_tcp_read_stop_cold_5();
  }
  iVar1 = (int)&lStack_c8;
  pcStack_e0 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  pcStack_e0 = (code *)(long)iVar1;
  uStack_e8 = 0;
  if (pcStack_e0 == (code *)0x0) {
    uStack_f8 = (code *)0x1ce217;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pcStack_e0 = (code *)(long)iVar1;
    uStack_e8 = 0;
    if (pcStack_e0 == (code *)0x0) {
      uStack_f8 = (code *)0x1ce249;
      iVar1 = uv_read_start(&tcp_handle,fail_cb);
      pcStack_e0 = (code *)(long)iVar1;
      uStack_e8 = 0;
      if (pcStack_e0 == (code *)0x0) {
        return;
      }
      goto LAB_001ce288;
    }
  }
  else {
    uStack_f8 = (code *)0x1ce279;
    connect_cb_cold_1();
  }
  uStack_f8 = (code *)0x1ce288;
  connect_cb_cold_2();
LAB_001ce288:
  uStack_f8 = timer_cb;
  connect_cb_cold_3();
  _auStack_100 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,&tcp_handle,auStack_100,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop(&tcp_handle);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void write1_cb(uv_write_t* req, int status) {
  uv_buf_t buf;
  int r;

  ASSERT_NOT_NULL(req);
  if (status) {
    ASSERT(shutdown_cb_called);
    return;
  }

  if (shutdown_requested)
    return;

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, req->handle, &buf, 1, write1_cb);
  ASSERT_OK(r);

  write_cb_called++;
}